

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_clip_bary2(REF_DBL *orig_bary,REF_DBL *bary)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  char *pcVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  
  dVar5 = 0.0;
  if (0.0 <= *orig_bary) {
    dVar5 = *orig_bary;
  }
  *bary = dVar5;
  dVar7 = 0.0;
  if (0.0 <= orig_bary[1]) {
    dVar7 = orig_bary[1];
  }
  bary[1] = dVar7;
  dVar4 = dVar5 + dVar7;
  auVar8._0_8_ = dVar4 * 1e+20;
  auVar8._8_8_ = dVar5;
  auVar9._8_8_ = -dVar5;
  auVar9._0_8_ = -auVar8._0_8_;
  auVar9 = maxpd(auVar8,auVar9);
  if (auVar9._8_8_ < auVar9._0_8_) {
    dVar10 = dVar7;
    if (dVar7 <= -dVar7) {
      dVar10 = -dVar7;
    }
    if (dVar10 < auVar9._0_8_) {
      auVar6._8_8_ = dVar7;
      auVar6._0_8_ = dVar5;
      auVar1._8_8_ = dVar4;
      auVar1._0_8_ = dVar4;
      auVar9 = divpd(auVar6,auVar1);
      *(undefined1 (*) [16])bary = auVar9;
      if (0.0 <= auVar9._0_8_) {
        if (0.0 <= auVar9._8_8_) {
          return 0;
        }
        pcVar3 = "bary[1] not positive";
        uVar2 = 0xbf6;
      }
      else {
        pcVar3 = "bary[0] not positive";
        uVar2 = 0xbf5;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar2,
             "ref_node_clip_bary2",pcVar3);
      return 1;
    }
  }
  printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n",dVar4,*orig_bary,orig_bary[1],
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xbe9,
         "ref_node_clip_bary2");
  printf("clipped bary\n%.18e %.18e\n",*bary,bary[1]);
  dVar5 = bary[1];
  dVar7 = *bary;
  dVar4 = *bary;
  *bary = 0.0;
  bary[1] = 0.0;
  bary[dVar4 <= dVar5 && dVar5 != dVar7] = 1.0;
  printf("modified bary\n%.18e %.18e\n",*bary,bary[1]);
  return 4;
}

Assistant:

REF_FCN REF_STATUS ref_node_clip_bary2(REF_DBL *orig_bary, REF_DBL *bary) {
  REF_DBL total;

  bary[0] = MAX(0.0, orig_bary[0]);
  bary[1] = MAX(0.0, orig_bary[1]);

  total = bary[0] + bary[1];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total)) {
    bary[0] /= total;
    bary[1] /= total;
  } else {
    REF_INT i, largest;
    printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n", __FILE__,
           __LINE__, __func__, total, orig_bary[0], orig_bary[1]);
    printf("clipped bary\n%.18e %.18e\n", bary[0], bary[1]);
    /* chose one node */
    largest = 0;
    for (i = 1; i < 2; i++)
      if (bary[i] > bary[largest]) largest = i;
    for (i = 0; i < 2; i++) bary[i] = 0.0;
    bary[largest] = 1.0;
    printf("modified bary\n%.18e %.18e\n", bary[0], bary[1]);
    return REF_DIV_ZERO;
  }

  RAS(bary[0] >= 0.0, "bary[0] not positive");
  RAS(bary[1] >= 0.0, "bary[1] not positive");

  return REF_SUCCESS;
}